

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

int sexp_peek_char(sexp ctx,sexp in)

{
  sexp psVar1;
  uint __c;
  sexp psVar2;
  
  psVar2 = (in->value).type.setters;
  if (psVar2 == (sexp)0x0) {
    __c = getc((FILE *)(in->value).type.getters);
  }
  else {
    psVar1 = (in->value).type.print;
    if (psVar1 < (sexp)(in->value).port.size) {
      (in->value).type.print = (sexp)((long)&psVar1->tag + 1);
      __c = (uint)*(byte *)((long)&psVar1->tag + (long)&psVar2->tag);
      goto LAB_001181b3;
    }
    __c = sexp_buffered_read_char(ctx,in);
  }
  if (__c == 0xffffffff) {
    return -1;
  }
  psVar2 = (sexp)(in->value).bytecode.max_depth;
  if (psVar2 == (sexp)0x0) {
    ungetc(__c,(FILE *)(in->value).type.getters);
    return __c;
  }
LAB_001181b3:
  psVar1 = (in->value).type.print;
  (in->value).type.print = (sexp)((long)&psVar1[-1].value + 0x60bf);
  (psVar2[-1].value.flonum_bits + 0x60bf)[(long)psVar1] = (char)__c;
  return __c;
}

Assistant:

static int sexp_peek_char(sexp ctx, sexp in) {
  int c = sexp_read_char(ctx, in);
  if (c != EOF) sexp_push_char(ctx, c, in);
  return c;
}